

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.hpp
# Opt level: O0

int __thiscall
zmq::decoder_base_t<zmq::v2_decoder_t,_zmq::shared_message_memory_allocator>::decode
          (decoder_base_t<zmq::v2_decoder_t,_zmq::shared_message_memory_allocator> *this,
          uchar *data_,size_t size_,size_t *bytes_used_)

{
  int iVar1;
  unsigned_long *puVar2;
  ulong *in_RCX;
  long *plVar3;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  int rc_1;
  size_t to_copy;
  int rc;
  code *local_80;
  code *local_68;
  unsigned_long local_40;
  size_t local_38;
  undefined4 local_2c;
  ulong *local_28;
  ulong local_20;
  long local_18;
  
  *in_RCX = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_RSI == *(long *)(in_RDI + 0x18)) {
    if (*(ulong *)(in_RDI + 0x20) < in_RDX) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","size_ <= _to_read",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/decoder.hpp"
              ,0x6e);
      fflush(_stderr);
      zmq_abort((char *)0x24f052);
    }
    *(ulong *)(in_RDI + 0x18) = local_20 + *(long *)(in_RDI + 0x18);
    *(ulong *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - local_20;
    *local_28 = local_20;
    while (*(long *)(in_RDI + 0x20) == 0) {
      local_68 = *(code **)(in_RDI + 8);
      plVar3 = (long *)(in_RDI + *(long *)(in_RDI + 0x10));
      if (((ulong)local_68 & 1) != 0) {
        local_68 = *(code **)(local_68 + *plVar3 + -1);
      }
      iVar1 = (*local_68)(plVar3,local_18 + *local_28);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_2c = 0;
    }
  }
  else {
    while (*local_28 < local_20) {
      local_40 = local_20 - *local_28;
      puVar2 = std::min<unsigned_long>((unsigned_long *)(in_RDI + 0x20),&local_40);
      local_38 = *puVar2;
      if (*(long *)(in_RDI + 0x18) != local_18 + *local_28) {
        memcpy(*(void **)(in_RDI + 0x18),(void *)(local_18 + *local_28),local_38);
      }
      *(size_t *)(in_RDI + 0x18) = local_38 + *(long *)(in_RDI + 0x18);
      *(size_t *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) - local_38;
      *local_28 = local_38 + *local_28;
      while (*(long *)(in_RDI + 0x20) == 0) {
        local_80 = *(code **)(in_RDI + 8);
        plVar3 = (long *)(in_RDI + *(long *)(in_RDI + 0x10));
        if (((ulong)local_80 & 1) != 0) {
          local_80 = *(code **)(local_80 + *plVar3 + -1);
        }
        iVar1 = (*local_80)(plVar3,local_18 + *local_28);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int decode (const unsigned char *data_,
                std::size_t size_,
                std::size_t &bytes_used_) ZMQ_FINAL
    {
        bytes_used_ = 0;

        //  In case of zero-copy simply adjust the pointers, no copying
        //  is required. Also, run the state machine in case all the data
        //  were processed.
        if (data_ == _read_pos) {
            zmq_assert (size_ <= _to_read);
            _read_pos += size_;
            _to_read -= size_;
            bytes_used_ = size_;

            while (!_to_read) {
                const int rc =
                  (static_cast<T *> (this)->*_next) (data_ + bytes_used_);
                if (rc != 0)
                    return rc;
            }
            return 0;
        }

        while (bytes_used_ < size_) {
            //  Copy the data from buffer to the message.
            const size_t to_copy = std::min (_to_read, size_ - bytes_used_);
            // Only copy when destination address is different from the
            // current address in the buffer.
            if (_read_pos != data_ + bytes_used_) {
                memcpy (_read_pos, data_ + bytes_used_, to_copy);
            }

            _read_pos += to_copy;
            _to_read -= to_copy;
            bytes_used_ += to_copy;
            //  Try to get more space in the message to fill in.
            //  If none is available, return.
            while (_to_read == 0) {
                // pass current address in the buffer
                const int rc =
                  (static_cast<T *> (this)->*_next) (data_ + bytes_used_);
                if (rc != 0)
                    return rc;
            }
        }

        return 0;
    }